

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.h
# Opt level: O1

void __thiscall llvm::buffer_ostream::~buffer_ostream(buffer_ostream *this)

{
  SmallVectorImpl<char> *pSVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  StringRef Str;
  
  (this->super_raw_svector_ostream).super_raw_pwrite_stream.super_raw_ostream._vptr_raw_ostream =
       (_func_int **)&PTR__buffer_ostream_01099690;
  pSVar1 = (this->super_raw_svector_ostream).OS;
  uVar2 = (pSVar1->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar3 = (pSVar1->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  Str.Length._0_4_ = uVar3;
  Str.Data = (char *)uVar2;
  Str.Length._4_4_ = 0;
  raw_ostream::operator<<(this->OS,Str);
  if (*(buffer_ostream **)&this->Buffer != this + 1) {
    free(*(buffer_ostream **)&this->Buffer);
  }
  raw_ostream::~raw_ostream((raw_ostream *)this);
  return;
}

Assistant:

~buffer_ostream() override { OS << str(); }